

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

bool __thiscall DialogPrompt::update(DialogPrompt *this,TextEvent textEvent)

{
  pointer pTVar1;
  pointer pTVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  TextField *f;
  pointer pTVar6;
  
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    if (textEvent.unicode == 0x1b) {
      UserInterface::closeAllDialogPrompts((int)this);
    }
    else if (textEvent.unicode == 0xd) {
      pTVar1 = (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->action).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(int)>::operator()(&pTVar1->action,pTVar1->actionOption);
      }
    }
    else if (textEvent.unicode == 9) {
      pTVar6 = (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar6) / 0x658;
      for (uVar3 = 1; uVar5 = (ulong)(uVar3 - 1), uVar5 < uVar4; uVar3 = uVar3 + 1) {
        if (pTVar6[uVar5].selected == true) {
          pTVar6[uVar5].selected = false;
          pTVar6[(ulong)uVar3 % uVar4].selected = true;
          return false;
        }
      }
    }
    else {
      pTVar2 = (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pTVar6 = (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>.
                    _M_impl.super__Vector_impl_data._M_start; pTVar6 != pTVar2; pTVar6 = pTVar6 + 1)
      {
        (*(pTVar6->super_UIComponent).super_Drawable._vptr_Drawable[4])(pTVar6,textEvent.unicode);
      }
    }
  }
  return false;
}

Assistant:

bool DialogPrompt::update(Event::TextEvent textEvent) {
    if (visible) {
        if (textEvent.unicode == 9) {    // If key tab pressed, attempt to switch to next text field.
            for (unsigned int i = 0; i < optionFields.size(); ++i) {
                if (optionFields[i].selected == true) {
                    optionFields[i].selected = false;
                    optionFields[(i + 1) % optionFields.size()].selected = true;
                    break;
                }
            }
        } else if (textEvent.unicode == 13) {    // If key enter pressed, activate the first button (assumed as confirmation action).
            if (optionButtons[0].action != nullptr) {
                optionButtons[0].action(optionButtons[0].actionOption);
            }
        } else if (textEvent.unicode == 27) {    // Escape pressed, close dialog.
            UserInterface::closeAllDialogPrompts();
        } else {    // Else, send the text event to the fields.
            for (TextField& f : optionFields) {
                f.update(textEvent);
            }
        }
    }
    return false;
}